

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void set_q_index(EncQuantDequantParams *enc_quant_dequant_params,int qindex,MACROBLOCK *x)

{
  Dequants *dequants;
  QUANTS *quants;
  MACROBLOCK *x_local;
  int qindex_local;
  EncQuantDequantParams *enc_quant_dequant_params_local;
  
  x->qindex = qindex;
  x->seg_skip_block = 0;
  x->plane[0].quant_QTX = (enc_quant_dequant_params->quants).y_quant[qindex];
  x->plane[0].quant_fp_QTX = (enc_quant_dequant_params->quants).y_quant_fp[qindex];
  x->plane[0].round_fp_QTX = (enc_quant_dequant_params->quants).y_round_fp[qindex];
  x->plane[0].quant_shift_QTX = (enc_quant_dequant_params->quants).y_quant_shift[qindex];
  x->plane[0].zbin_QTX = (enc_quant_dequant_params->quants).y_zbin[qindex];
  x->plane[0].round_QTX = (enc_quant_dequant_params->quants).y_round[qindex];
  x->plane[0].dequant_QTX = (enc_quant_dequant_params->dequants).y_dequant_QTX[qindex];
  x->plane[1].quant_QTX = (enc_quant_dequant_params->quants).u_quant[qindex];
  x->plane[1].quant_fp_QTX = (enc_quant_dequant_params->quants).u_quant_fp[qindex];
  x->plane[1].round_fp_QTX = (enc_quant_dequant_params->quants).u_round_fp[qindex];
  x->plane[1].quant_shift_QTX = (enc_quant_dequant_params->quants).u_quant_shift[qindex];
  x->plane[1].zbin_QTX = (enc_quant_dequant_params->quants).u_zbin[qindex];
  x->plane[1].round_QTX = (enc_quant_dequant_params->quants).u_round[qindex];
  x->plane[1].dequant_QTX = (enc_quant_dequant_params->dequants).u_dequant_QTX[qindex];
  x->plane[2].quant_QTX = (enc_quant_dequant_params->quants).v_quant[qindex];
  x->plane[2].quant_fp_QTX = (enc_quant_dequant_params->quants).v_quant_fp[qindex];
  x->plane[2].round_fp_QTX = (enc_quant_dequant_params->quants).v_round_fp[qindex];
  x->plane[2].quant_shift_QTX = (enc_quant_dequant_params->quants).v_quant_shift[qindex];
  x->plane[2].zbin_QTX = (enc_quant_dequant_params->quants).v_zbin[qindex];
  x->plane[2].round_QTX = (enc_quant_dequant_params->quants).v_round[qindex];
  x->plane[2].dequant_QTX = (enc_quant_dequant_params->dequants).v_dequant_QTX[qindex];
  return;
}

Assistant:

static void set_q_index(const EncQuantDequantParams *enc_quant_dequant_params,
                        int qindex, MACROBLOCK *x) {
  const QUANTS *const quants = &enc_quant_dequant_params->quants;
  const Dequants *const dequants = &enc_quant_dequant_params->dequants;
  x->qindex = qindex;
  x->seg_skip_block =
      0;  // TODO(angiebird): Find a proper place to init this variable.

  // Y
  x->plane[0].quant_QTX = quants->y_quant[qindex];
  x->plane[0].quant_fp_QTX = quants->y_quant_fp[qindex];
  x->plane[0].round_fp_QTX = quants->y_round_fp[qindex];
  x->plane[0].quant_shift_QTX = quants->y_quant_shift[qindex];
  x->plane[0].zbin_QTX = quants->y_zbin[qindex];
  x->plane[0].round_QTX = quants->y_round[qindex];
  x->plane[0].dequant_QTX = dequants->y_dequant_QTX[qindex];

  // U
  x->plane[1].quant_QTX = quants->u_quant[qindex];
  x->plane[1].quant_fp_QTX = quants->u_quant_fp[qindex];
  x->plane[1].round_fp_QTX = quants->u_round_fp[qindex];
  x->plane[1].quant_shift_QTX = quants->u_quant_shift[qindex];
  x->plane[1].zbin_QTX = quants->u_zbin[qindex];
  x->plane[1].round_QTX = quants->u_round[qindex];
  x->plane[1].dequant_QTX = dequants->u_dequant_QTX[qindex];

  // V
  x->plane[2].quant_QTX = quants->v_quant[qindex];
  x->plane[2].quant_fp_QTX = quants->v_quant_fp[qindex];
  x->plane[2].round_fp_QTX = quants->v_round_fp[qindex];
  x->plane[2].quant_shift_QTX = quants->v_quant_shift[qindex];
  x->plane[2].zbin_QTX = quants->v_zbin[qindex];
  x->plane[2].round_QTX = quants->v_round[qindex];
  x->plane[2].dequant_QTX = dequants->v_dequant_QTX[qindex];
}